

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

void __thiscall ParserContext::ParserContext(ParserContext *this,ContextCache *ccache)

{
  uint uVar1;
  uintm *puVar2;
  ulong uVar3;
  
  (this->naddr).base = (AddrSpace *)0x0;
  (this->calladdr).base = (AddrSpace *)0x0;
  (this->state).super__Vector_base<ConstructState,_std::allocator<ConstructState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).super__Vector_base<ConstructState,_std::allocator<ConstructState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).super__Vector_base<ConstructState,_std::allocator<ConstructState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->parsestate = 0;
  (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contextcommit).super__Vector_base<ContextSet,_std::allocator<ContextSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addr).base = (AddrSpace *)0x0;
  this->contcache = ccache;
  if (ccache == (ContextCache *)0x0) {
    this->contextsize = 0;
    puVar2 = (uintm *)0x0;
  }
  else {
    uVar1 = (*ccache->database->_vptr_ContextDatabase[8])();
    this->contextsize = uVar1;
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (ulong)uVar1 << 2;
    }
    puVar2 = (uintm *)operator_new__(uVar3);
  }
  this->context = puVar2;
  return;
}

Assistant:

ParserContext::ParserContext(ContextCache *ccache)

{
  parsestate = 0;
  contcache = ccache;
  if (ccache != (ContextCache *)0) {
    contextsize = ccache->getDatabase()->getContextSize();
    context = new uintm[ contextsize ];
  }
  else {
    contextsize = 0;
    context = (uintm *)0;
  }
}